

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLB.hpp
# Opt level: O3

void njoy::ENDFtk::section::SquareMatrix::verifyLB(int LB)

{
  undefined8 *puVar1;
  
  if (LB == 5) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal LB value");
  tools::Log::info<char_const*>("LB must be 5 for SquareMatrix");
  tools::Log::info<char_const*,int>("LB value: {}",LB);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLB( int LB ) {

  if ( LB != 5 ) {

      Log::error( "Encountered illegal LB value" );
      Log::info( "LB must be 5 for SquareMatrix" );
      Log::info( "LB value: {}", LB );
      throw std::exception();
  }
}